

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.h
# Opt level: O3

void __thiscall wasm::TypeUpdater::noteRecursiveRemoval(TypeUpdater *this,Expression *curr)

{
  undefined1 local_f0 [176];
  void *local_40;
  long local_30;
  
  noteRecursiveRemoval(wasm::Expression*)::Recurser::Recurser(wasm::TypeUpdater&,wasm::Expression__
            (local_f0,this,curr);
  if (local_40 != (void *)0x0) {
    operator_delete(local_40,local_30 - (long)local_40);
  }
  return;
}

Assistant:

void noteRecursiveRemoval(Expression* curr) {
    struct Recurser
      : public PostWalker<Recurser, UnifiedExpressionVisitor<Recurser>> {
      TypeUpdater& parent;

      Recurser(TypeUpdater& parent, Expression* root) : parent(parent) {
        walk(root);
      }

      void visitExpression(Expression* curr) { parent.noteRemoval(curr); }
    };

    Recurser(*this, curr);
  }